

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::minimize_clause(Internal *this)

{
  int64_t *piVar1;
  pointer pFVar2;
  uint uVar3;
  Internal *pIVar4;
  uint *puVar5;
  pointer puVar6;
  uint uVar7;
  bool bVar8;
  Profile *in_RSI;
  uint *puVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __tmp;
  pointer puVar10;
  uint *puVar11;
  Profile *profile;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  unsigned_long p;
  vector<int,_std::allocator<int>_> stack;
  unsigned_long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  pIVar4 = this->internal;
  profile = in_RSI;
  if ((pIVar4->profiles).minimize.level <= (pIVar4->opts).profile) {
    profile = &(pIVar4->profiles).minimize;
    time(pIVar4,(time_t *)in_RSI);
    start_profiling(pIVar4,profile,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  }
  External::check_learned_clause(this->external);
  minimize_sort_clause(this);
  puVar9 = (uint *)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  puVar5 = (uint *)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar11 = puVar9;
  for (; puVar9 != puVar5; puVar9 = puVar9 + 1) {
    profile = (Profile *)(ulong)-*puVar9;
    bVar8 = minimize_literal(this,-*puVar9,0);
    if (bVar8) {
      if (this->lrat == true) {
        profile = (Profile *)(ulong)-*puVar9;
        calculate_minimize_chain(this,-*puVar9,(vector<int,_std::allocator<int>_> *)&local_48);
        puVar6 = (this->mini_chain).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar10 = (this->mini_chain).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar10 != puVar6; puVar10 = puVar10 + 1) {
          local_50 = *puVar10;
          profile = (Profile *)&local_50;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&this->minimize_chain,(value_type_conflict5 *)&local_50);
        }
        puVar10 = (this->mini_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar10) {
          (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar10;
        }
      }
      piVar1 = &(this->stats).minimized;
      *piVar1 = *piVar1 + 1;
    }
    else {
      uVar3 = *puVar9;
      *puVar11 = uVar3;
      puVar11 = puVar11 + 1;
      uVar7 = -uVar3;
      if (0 < (int)uVar3) {
        uVar7 = uVar3;
      }
      pFVar2 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar7;
      *pFVar2 = (Flags)((uint)*pFVar2 | 2);
    }
  }
  if (puVar11 != puVar5) {
    profile = (Profile *)
              ((long)puVar11 -
               (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<int,_std::allocator<int>_>::resize(&this->clause,(size_type)profile);
  }
  clear_minimized_literals(this);
  puVar10 = (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while (puVar6 = (this->minimize_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start, puVar10 != puVar6) {
    puVar10 = puVar10 + -1;
    profile = (Profile *)puVar10;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->lrat_chain,puVar10)
    ;
  }
  if (puVar10 !=
      (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (this->minimize_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar6;
  }
  pIVar4 = this->internal;
  if ((pIVar4->profiles).minimize.level <= (pIVar4->opts).profile) {
    time(pIVar4,(time_t *)profile);
    stop_profiling(pIVar4,&(pIVar4->profiles).minimize,
                   (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Internal::minimize_clause () {
  START (minimize);
  LOG (clause, "minimizing first UIP clause");

  external->check_learned_clause (); // check 1st UIP learned clause first
  minimize_sort_clause ();

  assert (minimized.empty ());
  assert (minimize_chain.empty ());
  const auto end = clause.end ();
  auto j = clause.begin (), i = j;
  std::vector<int> stack;
  for (; i != end; i++) {
    if (minimize_literal (-*i)) {
      if (lrat) {
        assert (mini_chain.empty ());
        calculate_minimize_chain (-*i, stack);
        for (auto p : mini_chain) {
          minimize_chain.push_back (p);
        }
        mini_chain.clear ();
      }
      stats.minimized++;
    } else
      flags (*j++ = *i).keep = true;
  }
  LOG ("minimized %zd literals", (size_t) (clause.end () - j));
  if (j != end)
    clause.resize (j - clause.begin ());
  clear_minimized_literals ();
  for (auto p = minimize_chain.rbegin (); p != minimize_chain.rend ();
       p++) {
    lrat_chain.push_back (*p);
  }
  minimize_chain.clear ();
  STOP (minimize);
}